

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool ON_ChangeRationalNurbsCurveEndWeights
               (int dim,int order,int cv_count,int cvstride,double *cv,double *knot,double w0,
               double w1)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  int local_68;
  int local_64;
  int j;
  int i;
  double v1;
  double v0;
  double s;
  double r;
  double w1_local;
  double w0_local;
  double *knot_local;
  double *cv_local;
  int cvstride_local;
  int cv_count_local;
  int order_local;
  int dim_local;
  
  bVar2 = ON_IsValid(w0);
  if ((((bVar2) && (bVar2 = ON_IsValid(w1), bVar2)) && ((w0 != 0.0 || (NAN(w0))))) &&
     ((w1 != 0.0 || (NAN(w1))))) {
    if (((w0 < 0.0) && (0.0 < w1)) || ((0.0 < w0 && (w1 < 0.0)))) {
      order_local._3_1_ = false;
    }
    else {
      bVar2 = ON_ClampKnotVector(dim + 1,order,cv_count,cvstride,cv,knot,2);
      if (bVar2) {
        dVar4 = cv[dim];
        dVar1 = cv[cvstride * (cv_count + -1) + dim];
        bVar2 = ON_IsValid(dVar4);
        if (((bVar2) && (bVar2 = ON_IsValid(dVar1), bVar2)) &&
           (((dVar4 != 0.0 || (NAN(dVar4))) && ((dVar1 != 0.0 || (NAN(dVar1))))))) {
          if ((0.0 <= dVar4) || (dVar1 <= 0.0)) {
            if ((dVar4 <= 0.0) || (0.0 <= dVar1)) {
              s = w0 / dVar4;
              v0 = w1 / dVar1;
              if (ABS(s - v0) <= ABS(v0) * 1.490116119385e-08) {
                if ((s != v0) || (NAN(s) || NAN(v0))) {
                  v0 = (s + v0) * 0.5;
                }
                s = v0;
              }
              knot_local = cv;
              cv_local._4_4_ = cvstride;
              if (((v0 != 1.0) || (NAN(v0))) && ((dVar1 != w1 || (NAN(dVar1) || NAN(w1))))) {
                iVar3 = dim + 1;
                local_64 = cv_count;
                while (local_68 = iVar3, local_64 != 0) {
                  while (local_68 != 0) {
                    *knot_local = v0 * *knot_local;
                    local_68 = local_68 + -1;
                    knot_local = knot_local + 1;
                  }
                  knot_local = knot_local + (cvstride - iVar3);
                  local_64 = local_64 + -1;
                }
                cv_local._4_4_ = iVar3 + (cvstride - iVar3);
                knot_local = knot_local + -(long)(cv_local._4_4_ * cv_count);
              }
              if ((s != v0) || (NAN(s) || NAN(v0))) {
                dVar4 = knot_local[dim];
                dVar1 = knot_local[cv_local._4_4_ * (cv_count + -1) + dim];
                bVar2 = ON_IsValid(dVar4);
                if (((bVar2) && (bVar2 = ON_IsValid(dVar1), bVar2)) &&
                   ((dVar4 != 0.0 || (NAN(dVar4))))) {
                  dVar4 = pow(w0 / dVar4,1.0 / (double)(order + -1));
                  bVar2 = ON_IsValid(dVar4);
                  if (!bVar2) {
                    return false;
                  }
                  bVar2 = ON_ReparameterizeRationalNurbsCurve
                                    (dVar4,dim,order,cv_count,cv_local._4_4_,knot_local,knot);
                  if (!bVar2) {
                    return false;
                  }
                }
              }
              knot_local[dim] = w0;
              knot_local[cv_local._4_4_ * (cv_count + -1) + dim] = w1;
              order_local._3_1_ = true;
            }
            else {
              order_local._3_1_ = false;
            }
          }
          else {
            order_local._3_1_ = false;
          }
        }
        else {
          order_local._3_1_ = false;
        }
      }
      else {
        order_local._3_1_ = false;
      }
    }
  }
  else {
    order_local._3_1_ = false;
  }
  return order_local._3_1_;
}

Assistant:

bool ON_ChangeRationalNurbsCurveEndWeights(
          int dim, 
          int order, 
          int cv_count,
          int cvstride, 
          double* cv, 
          double* knot,
          double w0, 
          double w1
          )
{
  double r, s, v0, v1;
  int i, j;

  if ( !ON_IsValid(w0) || !ON_IsValid(w1) || 0.0 == w0 || 0.0 == w1 )
    return false;
  if ( (w0 < 0.0 && w1 > 0.0) || (w0 > 0.0 && w1 < 0.0) )
    return false;

  if ( !ON_ClampKnotVector( dim+1, order, cv_count, cvstride, cv, knot, 2 ) )
    return false;

  v0 = cv[dim];
  v1 = cv[cvstride*(cv_count-1)+dim];
  if (!ON_IsValid(v0) || !ON_IsValid(v1) || v0 == 0.0 || v1 == 0.0)
    return false;
  if (v0 < 0.0 && v1 > 0.0)
    return false;
  if ( v0 > 0.0 && v1 < 0.0)
    return false;

  r = w0/v0;
  s = w1/v1;
  if ( fabs(r-s) <= fabs(s)*ON_SQRT_EPSILON )
  {
    // simply scale
    if ( r != s )
      s = 0.5*(r+s);
    r = s;
  }

  if ( 1.0 != s && v1 != w1 )
  {
    // scale to get last weight set to w1
    dim++;
    cvstride -= dim;
    i = cv_count;
    while(i--)
    {
      j = dim;
      while(j--)
        *cv++ *= s;
      cv += cvstride;
    }
    cvstride += dim;
    dim--;
    cv -= cvstride*cv_count;
  }

  if ( r != s )
  {
    v0 = cv[dim];
    v1 = cv[cvstride*(cv_count-1)+dim];
    if ( ON_IsValid(v0) && ON_IsValid(v1) && 0.0 != v0 )
    {
      // need to scale and reparameterize
      r = pow(w0/v0,1.0/((double)(order-1)));
      if ( !ON_IsValid(r) )
        return false;
      if ( !ON_ReparameterizeRationalNurbsCurve(r,dim,order,cv_count,cvstride,cv,knot) )
        return false;
    }
  }

  // make sure weights agree to the last bit! 
  cv[dim] = w0;
  cv[cvstride*(cv_count-1)+dim] = w1;

  return true;
}